

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_Active_Test::TestBody(InterpreterTestSuite_PC_Active_Test *this)

{
  MockSpec<bool_()> *__return_storage_ptr__;
  bool bVar1;
  TypedExpectation<bool_()> *pTVar2;
  CommissionerAppMock *pCVar3;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_01;
  char *this_02;
  char *expected_predicate_value;
  char *pcVar4;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_510;
  allocator local_50f;
  allocator local_50e;
  allocator local_50d;
  allocator local_50c;
  allocator local_50b;
  allocator local_50a;
  allocator local_509;
  undefined1 local_508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4f8;
  undefined1 local_4e8 [16];
  code *local_4d8;
  code *local_4d0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  MatcherBase<const_ot::commissioner::Config_&> local_478;
  MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_458;
  undefined1 local_438 [16];
  code *local_428;
  code *pcStack_420;
  undefined1 local_418 [16];
  code *local_408;
  code *pcStack_400;
  Registry *local_3f8;
  undefined1 local_3f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  undefined1 local_3d0 [8];
  Expression expr;
  CommissionerAppMockPtr pcaMock;
  Value value;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_348;
  UnixTime local_338;
  UnixTime local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  undefined1 local_310 [352];
  undefined1 local_1b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  _Base_ptr local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  local_3f8 = ctx.mRegistry;
  std::__cxx11::string::string((string *)&value,"127.0.0.1",(allocator *)&local_348);
  local_458._vptr_MatcherBase = (_func_int **)0x0;
  local_458.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_458.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&gtest_ar_,"1.1",&local_509);
  ot::commissioner::BorderAgent::State::State((State *)(local_3d0 + 4),0,0,0,0,0);
  std::__cxx11::string::string((string *)local_508,"net1",&local_50a);
  std::__cxx11::string::string((string *)local_4e8,"",&local_50b);
  std::__cxx11::string::string((string *)local_3f0,"",&local_50c);
  std::__cxx11::string::string((string *)local_418,"",&local_50d);
  local_478._vptr_MatcherBase = (_func_int **)0x0;
  local_478.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_478.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_438,"domain1",&local_50e);
  pcVar4 = "";
  std::__cxx11::string::string((string *)&expr,"",&local_50f);
  ot::commissioner::UnixTime::UnixTime(&local_330,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_328,(string *)&value,0x4e21,(ByteArray *)&local_458,
             (string *)&gtest_ar_,(State)local_3d0._4_4_,(string *)local_508,1,(string *)local_4e8,
             (string *)local_3f0,(Timestamp)0x0,0,(string *)local_418,(ByteArray *)&local_478,
             (string *)local_438,'\0',0,(string *)&expr,local_330,0x103f);
  pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       ot::commissioner::persistent_storage::Registry::Add(local_3f8,(BorderAgent *)local_328);
  local_510 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",(Status *)&pcaMock,&local_510);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_328);
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)local_438);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_478);
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::~string((string *)local_4e8);
  std::__cxx11::string::~string((string *)local_508);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458);
  std::__cxx11::string::~string((string *)&value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_328);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x480,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if ((_func_int **)local_328._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_328._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_3f8 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&value,"127.0.0.2",(allocator *)&local_348);
    local_458._vptr_MatcherBase = (_func_int **)0x0;
    local_458.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_458.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)&gtest_ar_,"1.1",&local_509);
    ot::commissioner::BorderAgent::State::State((State *)local_3d0,0,0,0,0,0);
    std::__cxx11::string::string((string *)local_508,"net2",&local_50a);
    std::__cxx11::string::string((string *)local_4e8,"",&local_50b);
    std::__cxx11::string::string((string *)local_3f0,"",&local_50c);
    std::__cxx11::string::string((string *)local_418,"",&local_50d);
    local_478._vptr_MatcherBase = (_func_int **)0x0;
    local_478.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_478.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)local_438,"domain1",&local_50e);
    pcVar4 = "";
    std::__cxx11::string::string((string *)&expr,"",&local_50f);
    ot::commissioner::UnixTime::UnixTime(&local_338,0);
    expected_predicate_value = (char *)(ulong)(uint)local_3d0._0_4_;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)local_328,(string *)&value,0x4e21,(ByteArray *)&local_458,
               (string *)&gtest_ar_,(State)local_3d0._0_4_,(string *)local_508,2,(string *)local_4e8
               ,(string *)local_3f0,(Timestamp)0x0,0,(string *)local_418,(ByteArray *)&local_478,
               (string *)local_438,'\0',0,(string *)&expr,local_338,0x103f);
    pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
         ot::commissioner::persistent_storage::Registry::Add(local_3f8,(BorderAgent *)local_328);
    local_510 = kSuccess;
    this_02 = 
    "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
    ;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",(Status *)&pcaMock,&local_510);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_328);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)local_438);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_478);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string((string *)local_4e8);
    std::__cxx11::string::~string((string *)local_508);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458);
    std::__cxx11::string::~string((string *)&value);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_._0_8_ =
           CommissionerAppMock::gmock_IsActive
                     ((MockSpec<bool_()> *)
                      ctx.mDefaultCommissionerObject.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (CommissionerAppMock *)this_02);
      testing::internal::GetWithoutMatchers();
      pTVar2 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         ((MockSpec<bool_()> *)&gtest_ar_,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x487,"*ctx.mDefaultCommissionerObject","IsActive()");
      pTVar2 = testing::internal::TypedExpectation<bool_()>::Times(pTVar2,2);
      testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_508,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)local_328,(ReturnAction *)local_508);
      pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar2,(Action<bool_()> *)local_328);
      testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_4e8,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)&value,(ReturnAction *)local_4e8);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar2,(Action<bool_()> *)&value);
      std::_Function_base::~_Function_base((_Function_base *)&value);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e8 + 8));
      std::_Function_base::~_Function_base((_Function_base *)local_328);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      value.mError.mCode = kNone;
      value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mMessage.field_2._M_local_buf[0] = '\0';
      value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
      value.mData._M_string_length = 0;
      value.mData.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)local_328,"active",(allocator *)local_508);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_328);
      ot::commissioner::Interpreter::Eval((Value *)local_328,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_328);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_328);
      bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x48e,(char *)local_328._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
        std::__cxx11::string::~string((string *)local_328);
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string((string *)local_328,"active",(allocator *)local_508);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_328);
      ot::commissioner::Interpreter::Eval((Value *)local_328,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_328);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_328);
      gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x493,(char *)local_328._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
        std::__cxx11::string::~string((string *)local_328);
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pCVar3 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar3,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar3);
      std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<CommissionerAppMock,void>
                ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)&pcaMock,pCVar3);
      testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
      testing::A<ot::commissioner::Config_const&>();
      CommissionerAppStaticExpecter::gmock_Create
                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)&gtest_ar_,&ctx.mCommissionerAppStaticExpecter,
                 (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_458,
                 (Matcher<const_ot::commissioner::Config_&> *)&local_478);
      testing::internal::GetWithoutMatchers();
      this_00 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::InternalExpectedAt
                          ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                            *)&gtest_ar_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x496,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      local_188._0_4_ = _S_red;
      local_180._M_p = (pointer)&local_170;
      local_178 = (_Base_ptr)0x0;
      local_170._M_local_buf[0] = '\0';
      testing::Return<ot::commissioner::Error>((testing *)&local_348,(Error *)local_188);
      std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,
                 &local_348);
      aStack_4f8._M_allocated_capacity = 0;
      local_4e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_508._0_8_ = (pointer)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_4f8._8_8_ = 0;
      local_4d8 = std::
                  _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1175:36)>
                  ::_M_manager;
      local_4d0 = std::
                  _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1175:36)>
                  ::_M_invoke;
      local_4e8._0_8_ = (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)&pcaMock;
      std::_Function_base::~_Function_base((_Function_base *)local_508);
      std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_3f0,
                 (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_4e8)
      ;
      local_408 = (code *)0x0;
      pcStack_400 = (code *)0x0;
      local_418._0_8_ = (pointer)0x0;
      local_418._8_8_ = 0;
      aStack_4f8._M_allocated_capacity = 0;
      aStack_4f8._8_8_ = 0;
      local_508._0_8_ = (pointer)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_418._0_8_ = operator_new(0x20);
      *(undefined8 *)local_418._0_8_ = 0;
      *(undefined8 *)(local_418._0_8_ + 8) = 0;
      *(undefined8 *)(local_418._0_8_ + 0x10) = 0;
      *(undefined8 *)(local_418._0_8_ + 0x18) = local_3e0._8_8_;
      if (local_3e0._M_allocated_capacity != 0) {
        *(undefined8 *)local_418._0_8_ = local_3f0._0_8_;
        *(undefined8 *)(local_418._0_8_ + 8) = local_3f0._8_8_;
        *(size_type *)(local_418._0_8_ + 0x10) = local_3e0._M_allocated_capacity;
        local_3e0._M_allocated_capacity = 0;
        local_3e0._8_8_ = 0;
      }
      local_418._8_8_ = local_508._8_8_;
      aStack_4f8._M_allocated_capacity = 0;
      aStack_4f8._8_8_ = 0;
      local_508._0_8_ = (pointer)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_408 = std::_Function_handler::operator_cast_to_Action;
      pcStack_400 = std::_Function_handler::operator_cast_to_Action;
      std::_Function_base::~_Function_base((_Function_base *)local_508);
      std::_Function_base::~_Function_base((_Function_base *)local_3f0);
      std::_Function_base::~_Function_base((_Function_base *)local_4e8);
      __l._M_len = 1;
      __l._M_array = (iterator)local_418;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                *)local_328,__l,(allocator_type *)local_508);
      std::_Function_base::~_Function_base((_Function_base *)local_418);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)local_310,(ReturnAction *)&gtest_ar);
      local_428 = (code *)0x0;
      pcStack_420 = (code *)0x0;
      local_438._0_8_ = (pointer)0x0;
      local_438._8_8_ = 0;
      aStack_4f8._M_allocated_capacity = 0;
      aStack_4f8._8_8_ = 0;
      local_508._0_8_ = (pointer)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_438._0_8_ = operator_new(0x38);
      *(undefined8 *)local_438._0_8_ = local_328._0_8_;
      *(undefined8 *)(local_438._0_8_ + 8) = local_328._8_8_;
      *(undefined1 (*) [8])(local_438._0_8_ + 0x10) = local_318;
      local_328._0_8_ = (_func_int **)0x0;
      local_328._8_8_ = (pointer)0x0;
      local_318 = (undefined1  [8])0x0;
      *(undefined8 *)(local_438._0_8_ + 0x18) = 0;
      *(undefined8 *)(local_438._0_8_ + 0x20) = 0;
      *(undefined8 *)(local_438._0_8_ + 0x28) = 0;
      *(undefined8 *)(local_438._0_8_ + 0x30) = local_310._24_8_;
      if ((pointer)local_310._16_8_ != (pointer)0x0) {
        *(undefined8 *)(local_438._0_8_ + 0x18) = local_310._0_8_;
        *(undefined8 *)(local_438._0_8_ + 0x20) = local_310._8_8_;
        *(undefined8 *)(local_438._0_8_ + 0x28) = local_310._16_8_;
        local_310._16_8_ = (pointer)0x0;
        local_310._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      local_438._8_8_ = local_508._8_8_;
      aStack_4f8._M_allocated_capacity = 0;
      aStack_4f8._8_8_ = 0;
      local_508._0_8_ = (long *)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_428 = std::_Function_handler::operator_cast_to_Action;
      pcStack_420 = std::_Function_handler::operator_cast_to_Action;
      std::_Function_base::~_Function_base((_Function_base *)local_508);
      anon_func::Op::~Op((Op *)local_328);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillOnce(this_00,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_438);
      std::_Function_base::~_Function_base((_Function_base *)local_438);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
      std::__cxx11::string::~string((string *)&local_180);
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                      *)&gtest_ar_.message_);
      testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase(&local_478);
      testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
      ~MatcherBase(&local_458);
      pCVar3 = (CommissionerAppMock *)
               CONCAT71(pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        (Status)pcaMock.
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      testing::internal::GetWithoutMatchers();
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_328,pCVar3,(WithoutMatchers *)local_4e8,
                 (Function<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)0x0);
      this_01 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::InternalExpectedAt
                          ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)local_328,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x498,"*pcaMock","Start");
      local_1b0._0_4_ = kNone;
      local_1a8._M_allocated_capacity = (size_type)&local_198;
      local_1a8._8_8_ = 0;
      local_198._M_local_buf[0] = '\0';
      testing::Return<ot::commissioner::Error>((testing *)local_508,(Error *)local_1b0);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)&gtest_ar_,(ReturnAction *)local_508);
      pCVar3 = (CommissionerAppMock *)&gtest_ar_;
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(this_01,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)pCVar3);
      std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8));
      std::__cxx11::string::~string((string *)(local_1b0 + 8));
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                      *)(local_328 + 8));
      __return_storage_ptr__ =
           (MockSpec<bool_()> *)
           CONCAT71(pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._1_7_,
                    (Status)pcaMock.
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      testing::internal::GetWithoutMatchers();
      local_4e8._0_8_ = CommissionerAppMock::gmock_IsActive(__return_storage_ptr__,pCVar3);
      pTVar2 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         ((MockSpec<bool_()> *)local_4e8,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x499,"*pcaMock","IsActive");
      pTVar2 = testing::internal::TypedExpectation<bool_()>::Times(pTVar2,3);
      testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_3f0,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)local_328,(ReturnAction *)local_3f0);
      pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar2,(Action<bool_()> *)local_328);
      testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_418,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)&gtest_ar_,(ReturnAction *)local_418);
      pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar2,(Action<bool_()> *)&gtest_ar_);
      testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_438,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<bool_()> *)local_508,(ReturnAction *)local_438);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar2,(Action<bool_()> *)local_508);
      std::_Function_base::~_Function_base((_Function_base *)local_508);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
      std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8));
      std::_Function_base::~_Function_base((_Function_base *)local_328);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3f0 + 8));
      std::__cxx11::string::string((string *)local_328,"start --nwk net1",(allocator *)local_508);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_328);
      ot::commissioner::Interpreter::Eval((Value *)local_328,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_328);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_328);
      gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x49c,(char *)local_328._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
        std::__cxx11::string::~string((string *)local_328);
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string((string *)local_328,"active --nwk net1",(allocator *)local_508);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_328);
      ot::commissioner::Interpreter::Eval((Value *)local_328,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_328);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_328);
      gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a0,(char *)local_328._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
        std::__cxx11::string::~string((string *)local_328);
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string((string *)local_328,"active --nwk net1",(allocator *)local_508);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_328);
      ot::commissioner::Interpreter::Eval((Value *)local_328,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_328);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_328);
      gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a4,(char *)local_328._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4e8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e8);
        std::__cxx11::string::~string((string *)local_328);
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ot::commissioner::Interpreter::Value::~Value(&value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expr);
      goto LAB_00157010;
    }
    testing::Message::Message((Message *)local_328);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x485,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if ((_func_int **)local_328._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_328._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_00157010:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Active)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, IsActive()).Times(2).WillOnce(Return(false)).WillOnce(Return(true));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    // TODO add result verification

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    CommissionerAppMockPtr pcaMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = pcaMock; }), Return(Error{})));
    EXPECT_CALL(*pcaMock, Start).WillOnce(Return(Error{}));
    EXPECT_CALL(*pcaMock, IsActive).Times(3).WillOnce(Return(false)).WillOnce(Return(true)).WillOnce(Return(false));
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}